

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O0

Status __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_solveRealStable(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,bool acceptUnbounded,bool acceptInfeasible,
                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *primal,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *dual,
                  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                  *basisStatusRows,
                  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                  *basisStatusCols,bool forceNoSimplifier)

{
  type_conflict5 tVar1;
  Verbosity VVar2;
  int iVar3;
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar4;
  SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar5;
  undefined8 in_RCX;
  byte in_DL;
  undefined1 uVar6;
  byte in_SIL;
  undefined1 uVar7;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  byte in_stack_00000010;
  Verbosity old_verbosity_10;
  Verbosity old_verbosity_9;
  Verbosity old_verbosity_8;
  Verbosity old_verbosity_7;
  Verbosity old_verbosity_6;
  Verbosity old_verbosity_5;
  Verbosity old_verbosity_4;
  Verbosity old_verbosity_3;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  Verbosity old_verbosity;
  int type;
  int scaler;
  int simplifier;
  int pricer;
  int ratiotester;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  markowitz;
  bool turnedoffPre;
  bool switchedPricer;
  bool switchedRatiotester;
  bool switchedSimplifier;
  bool switchedScaler;
  bool tightenedTolerances;
  bool relaxedTolerances;
  bool increasedMarkowitz;
  bool initialSolve;
  bool solvedFromScratch;
  bool solved;
  bool fromScratch;
  Status result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff978;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff980;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff988;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff990;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff998;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff9a8;
  SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff9b0;
  byte local_62a;
  byte local_629;
  Verbosity local_5e8;
  Verbosity local_5e4 [3];
  Verbosity local_5d8;
  Verbosity local_5d4 [4];
  undefined1 in_stack_fffffffffffffa3f;
  int in_stack_fffffffffffffa40;
  IntParam in_stack_fffffffffffffa44;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffa48;
  undefined1 local_550 [56];
  undefined1 local_518 [64];
  undefined8 local_4d8;
  Verbosity local_498;
  Verbosity local_494 [17];
  undefined8 local_450;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffc10;
  undefined8 local_3d8;
  DLPSV local_3d0;
  undefined8 local_398;
  undefined8 local_358;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_318;
  undefined1 local_2e0 [64];
  undefined8 local_2a0;
  Verbosity local_25c;
  Verbosity local_258 [3];
  Verbosity local_24c;
  Verbosity local_248 [6];
  undefined8 local_230;
  undefined1 local_228 [192];
  undefined6 in_stack_fffffffffffffea0;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *dual_00;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_b8;
  Item *local_b0;
  _func_int **local_a8;
  undefined1 *local_a0;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_98;
  undefined1 *local_90;
  Item *local_88;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_79;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  undefined8 *local_70;
  DLPSV *local_68;
  DLPSV *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  DLPSV *local_50;
  undefined8 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  pointer local_30;
  pointer local_28;
  pointer local_20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  pointer local_10;
  pointer local_8;
  
  uVar7 = in_SIL & 1;
  uVar6 = in_DL & 1;
  local_228[0xaf] = in_stack_00000010 & 1;
  local_228._168_4_ = UNKNOWN;
  local_228[0xa7] = 0;
  local_228[0xa6] = 0;
  local_228[0xa5] = 0;
  local_228[0xa4] = 1;
  local_228[0xa3] = 0;
  local_228[0xa2] = 0;
  local_228[0xa1] = 0;
  local_228[0xa0] = 0;
  local_228[0x9f] = 0;
  local_228[0x9e] = 0;
  local_228[0x9d] = 0;
  local_228[0x9c] = 0;
  dual_00 = in_RDI;
  SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::markowitz(in_stack_fffffffffffff978);
  local_228._96_4_ = intParam(in_RDI,RATIOTESTER);
  local_228._92_4_ = intParam(in_RDI,PRICER);
  local_228._88_4_ = intParam(in_RDI,SIMPLIFIER);
  local_228._84_4_ = intParam(in_RDI,SCALER);
  local_228._80_4_ = intParam(in_RDI,ALGORITHM);
  if ((local_228[0xaf] & 1) != 0) {
    setIntParam(in_stack_fffffffffffffa48,in_stack_fffffffffffffa44,in_stack_fffffffffffffa40,
                (bool)in_stack_fffffffffffffa3f);
  }
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                while( true ) {
                  while( true ) {
                    local_228._168_4_ =
                         _solveRealForRational
                                   ((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)in_stack_fffffffffffffec0,
                                    (bool)(char)((ulong)in_stack_fffffffffffffeb8 >> 0x38),
                                    in_stack_fffffffffffffeb0,
                                    (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)dual_00,
                                    (DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                                     *)CONCAT17(uVar7,CONCAT16(uVar6,in_stack_fffffffffffffea0)),
                                    (DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                                     *)in_RCX);
                    local_629 = 1;
                    if ((local_228._168_4_ != OPTIMAL) &&
                       ((local_228._168_4_ != INFEASIBLE || (local_629 = 1, (uVar6 & 1) == 0)))) {
                      local_62a = 0;
                      if (local_228._168_4_ == UNBOUNDED) {
                        local_62a = uVar7;
                      }
                      local_629 = local_62a;
                    }
                    local_228[0xa6] = local_629 & 1;
                    if (((local_228[0xa6] != 0) || (local_228._168_4_ == ABORT_TIME)) ||
                       (local_228._168_4_ == ABORT_ITER)) goto LAB_00484ded;
                    if ((local_228[0xa4] & 1) != 0) {
                      if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)0xfffffffffffffff8) &&
                         (VVar2 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar2)) {
                        local_228._76_4_ = SPxOut::getVerbosity(&in_RDI->spxout);
                        local_228._72_4_ = 3;
                        SPxOut::setVerbosity(&in_RDI->spxout,(Verbosity *)(local_228 + 0x48));
                        soplex::operator<<((SPxOut *)in_stack_fffffffffffff980,
                                           (char *)in_stack_fffffffffffff978);
                        soplex::operator<<((SPxOut *)in_stack_fffffffffffff980,
                                           (_func_ostream_ptr_ostream_ptr *)
                                           in_stack_fffffffffffff978);
                        SPxOut::setVerbosity(&in_RDI->spxout,(Verbosity *)(local_228 + 0x4c));
                      }
                      local_228[0xa4] = 0;
                    }
                    if (((local_228[0x9c] & 1) != 0) ||
                       ((iVar3 = intParam(in_RDI,SIMPLIFIER), iVar3 == 0 &&
                        (iVar3 = intParam(in_RDI,SCALER), iVar3 == 0)))) break;
                    if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)0xfffffffffffffff8) &&
                       (VVar2 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar2)) {
                      local_228._68_4_ = SPxOut::getVerbosity(&in_RDI->spxout);
                      local_228._64_4_ = 3;
                      SPxOut::setVerbosity(&in_RDI->spxout,(Verbosity *)(local_228 + 0x40));
                      soplex::operator<<((SPxOut *)in_stack_fffffffffffff980,
                                         (char *)in_stack_fffffffffffff978);
                      soplex::operator<<((SPxOut *)in_stack_fffffffffffff980,
                                         (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff978)
                      ;
                      SPxOut::setVerbosity(&in_RDI->spxout,(Verbosity *)(local_228 + 0x44));
                    }
                    local_228[0x9c] = 1;
                    setIntParam(in_stack_fffffffffffffa48,in_stack_fffffffffffffa44,
                                in_stack_fffffffffffffa40,(bool)in_stack_fffffffffffffa3f);
                    setIntParam(in_stack_fffffffffffffa48,in_stack_fffffffffffffa44,
                                in_stack_fffffffffffffa40,(bool)in_stack_fffffffffffffa3f);
                    local_228[0xa7] = 1;
                    local_228[0xa5] = 1;
                  }
                  setIntParam(in_stack_fffffffffffffa48,in_stack_fffffffffffffa44,
                              in_stack_fffffffffffffa40,(bool)in_stack_fffffffffffffa3f);
                  setIntParam(in_stack_fffffffffffffa48,in_stack_fffffffffffffa44,
                              in_stack_fffffffffffffa40,(bool)in_stack_fffffffffffffa3f);
                  if ((local_228[0xa3] & 1) != 0) break;
                  if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)0xfffffffffffffff8) &&
                     (VVar2 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar2)) {
                    local_228._60_4_ = SPxOut::getVerbosity(&in_RDI->spxout);
                    local_228._56_4_ = 3;
                    SPxOut::setVerbosity(&in_RDI->spxout,(Verbosity *)(local_228 + 0x38));
                    soplex::operator<<((SPxOut *)in_stack_fffffffffffff980,
                                       (char *)in_stack_fffffffffffff978);
                    soplex::operator<<((SPxOut *)in_stack_fffffffffffff980,
                                       (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff978);
                    SPxOut::setVerbosity(&in_RDI->spxout,(Verbosity *)(local_228 + 0x3c));
                  }
                  local_230 = 0x3feccccccccccccd;
                  in_stack_fffffffffffffec0 = local_228;
                  in_stack_fffffffffffffeb8 = &local_230;
                  in_stack_fffffffffffffeb0 =
                       (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)0x0;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                  cpp_dec_float<double>
                            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff990,
                             (double)in_stack_fffffffffffff988,in_stack_fffffffffffff980);
                  SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::setMarkowitz(in_stack_fffffffffffff9b0,
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)in_stack_fffffffffffff9a8);
                  local_228[0xa3] = 1;
                  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::factorize(in_stack_fffffffffffffc10);
                }
                if ((local_228[0xa5] & 1) != 0) break;
                if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)0xfffffffffffffff8) &&
                   (VVar2 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar2)) {
                  local_248[2] = SPxOut::getVerbosity(&in_RDI->spxout);
                  local_248[1] = 3;
                  SPxOut::setVerbosity(&in_RDI->spxout,local_248 + 1);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffff980,
                                     (char *)in_stack_fffffffffffff978);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffff980,
                                     (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff978);
                  SPxOut::setVerbosity(&in_RDI->spxout,local_248 + 2);
                }
                local_228[0xa7] = 1;
                local_228[0xa5] = 1;
              }
              setIntParam(in_stack_fffffffffffffa48,in_stack_fffffffffffffa44,
                          in_stack_fffffffffffffa40,(bool)in_stack_fffffffffffffa3f);
              setIntParam(in_stack_fffffffffffffa48,in_stack_fffffffffffffa44,
                          in_stack_fffffffffffffa40,(bool)in_stack_fffffffffffffa3f);
              if ((local_228[0xa0] & 1) != 0) break;
              if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)0xfffffffffffffff8) &&
                 (VVar2 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar2)) {
                local_248[0] = SPxOut::getVerbosity(&in_RDI->spxout);
                local_24c = INFO1;
                SPxOut::setVerbosity(&in_RDI->spxout,&local_24c);
                soplex::operator<<((SPxOut *)in_stack_fffffffffffff980,
                                   (char *)in_stack_fffffffffffff978);
                soplex::operator<<((SPxOut *)in_stack_fffffffffffff980,
                                   (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff978);
                SPxOut::setVerbosity(&in_RDI->spxout,local_248);
              }
              if (local_228._84_4_ == 0) {
                setIntParam(in_stack_fffffffffffffa48,in_stack_fffffffffffffa44,
                            in_stack_fffffffffffffa40,(bool)in_stack_fffffffffffffa3f);
              }
              else {
                setIntParam(in_stack_fffffffffffffa48,in_stack_fffffffffffffa44,
                            in_stack_fffffffffffffa40,(bool)in_stack_fffffffffffffa3f);
              }
              local_228[0xa7] = 1;
              local_228[0xa5] = 1;
              local_228[0xa0] = 1;
            }
            if (((local_228[0x9f] & 1) != 0) || ((local_228[0xaf] & 1) != 0)) break;
            if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)0xfffffffffffffff8) &&
               (VVar2 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar2)) {
              local_258[2] = SPxOut::getVerbosity(&in_RDI->spxout);
              local_258[1] = 3;
              SPxOut::setVerbosity(&in_RDI->spxout,local_258 + 1);
              soplex::operator<<((SPxOut *)in_stack_fffffffffffff980,
                                 (char *)in_stack_fffffffffffff978);
              soplex::operator<<((SPxOut *)in_stack_fffffffffffff980,
                                 (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff978);
              SPxOut::setVerbosity(&in_RDI->spxout,local_258 + 2);
            }
            if (local_228._88_4_ == 0) {
              setIntParam(in_stack_fffffffffffffa48,in_stack_fffffffffffffa44,
                          in_stack_fffffffffffffa40,(bool)in_stack_fffffffffffffa3f);
            }
            else {
              setIntParam(in_stack_fffffffffffffa48,in_stack_fffffffffffffa44,
                          in_stack_fffffffffffffa40,(bool)in_stack_fffffffffffffa3f);
            }
            local_228[0xa7] = 1;
            local_228[0xa5] = 1;
            local_228[0x9f] = 1;
          }
          setIntParam(in_stack_fffffffffffffa48,in_stack_fffffffffffffa44,in_stack_fffffffffffffa40,
                      (bool)in_stack_fffffffffffffa3f);
          if ((local_228[0xa2] & 1) != 0) break;
          if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)0xfffffffffffffff8) &&
             (VVar2 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar2)) {
            local_258[0] = SPxOut::getVerbosity(&in_RDI->spxout);
            local_25c = INFO1;
            SPxOut::setVerbosity(&in_RDI->spxout,&local_25c);
            soplex::operator<<((SPxOut *)in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978
                              );
            soplex::operator<<((SPxOut *)in_stack_fffffffffffff980,
                               (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff978);
            SPxOut::setVerbosity(&in_RDI->spxout,local_258);
          }
          setIntParam(in_stack_fffffffffffffa48,in_stack_fffffffffffffa44,in_stack_fffffffffffffa40,
                      (bool)in_stack_fffffffffffffa3f);
          SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::entertol(in_stack_fffffffffffff998);
          local_2a0 = 0x3eb0c6f7a0b5ed8d;
          tVar1 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_fffffffffffff978,(double *)0x4843e0);
          if (tVar1) {
            local_2e0._0_4_ = 0xd2f1a9fc;
            local_2e0._4_4_ = 0x3f50624d;
            SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::entertol(in_stack_fffffffffffff998);
            local_28 = (pointer)(local_2e0 + 8);
            local_30 = (pointer)local_2e0;
            local_38 = &local_318;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_39,local_38);
            local_20 = (pointer)(local_2e0 + 8);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff980);
            local_10 = (pointer)(local_2e0 + 8);
            local_8 = local_30;
            local_18 = local_38;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff980,
                       (double *)in_stack_fffffffffffff978,(cpp_dec_float<50U,_int,_void> *)0x4844d0
                      );
            SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::scaleEntertol(in_stack_fffffffffffff980,
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)in_stack_fffffffffffff978);
          }
          else {
            in_stack_fffffffffffff9b0 =
                 (SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)&in_RDI->_solver;
            local_358 = 0x408f400000000000;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff990,
                       (double)in_stack_fffffffffffff988,in_stack_fffffffffffff980);
            SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::scaleEntertol(in_stack_fffffffffffff980,
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)in_stack_fffffffffffff978);
          }
          SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::leavetol(in_stack_fffffffffffff998);
          local_398 = 0x3eb0c6f7a0b5ed8d;
          tVar1 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_fffffffffffff978,(double *)0x4845b2);
          if (tVar1) {
            in_stack_fffffffffffff9a8 = &in_RDI->_solver;
            local_3d8 = 0x3f50624dd2f1a9fc;
            SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::leavetol(in_stack_fffffffffffff998);
            local_68 = &local_3d0;
            local_70 = &local_3d8;
            local_78 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&stack0xfffffffffffffbf0;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_79,local_78);
            local_60 = &local_3d0;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff980);
            local_50 = &local_3d0;
            local_48 = local_70;
            local_58 = local_78;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff980,
                       (double *)in_stack_fffffffffffff978,(cpp_dec_float<50U,_int,_void> *)0x4846a2
                      );
            SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::scaleLeavetol(in_stack_fffffffffffff980,
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)in_stack_fffffffffffff978);
          }
          else {
            local_450 = 0x408f400000000000;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff990,
                       (double)in_stack_fffffffffffff988,in_stack_fffffffffffff980);
            SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::scaleLeavetol(in_stack_fffffffffffff980,
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)in_stack_fffffffffffff978);
          }
          SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::entertol(in_stack_fffffffffffff998);
          local_494[1] = 0xd2f1a9fc;
          local_494[2] = 0x3f50624d;
          local_228[0xa2] =
               boost::multiprecision::operator>=
                         ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)in_stack_fffffffffffff978,(double *)0x484784);
          local_228[0xa5] = 0;
        }
        if (((local_228[0xa1] & 1) != 0) || (local_228._168_4_ == INFEASIBLE)) break;
        if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)0xfffffffffffffff8) &&
           (VVar2 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar2)) {
          local_494[0] = SPxOut::getVerbosity(&in_RDI->spxout);
          local_498 = INFO1;
          SPxOut::setVerbosity(&in_RDI->spxout,&local_498);
          soplex::operator<<((SPxOut *)in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978);
          soplex::operator<<((SPxOut *)in_stack_fffffffffffff980,
                             (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff978);
          SPxOut::setVerbosity(&in_RDI->spxout,local_494);
        }
        setIntParam(in_stack_fffffffffffffa48,in_stack_fffffffffffffa44,in_stack_fffffffffffffa40,
                    (bool)in_stack_fffffffffffffa3f);
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::entertol(in_stack_fffffffffffff998);
        local_4d8 = 0x3eb0c6f7a0b5ed8d;
        tVar1 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_fffffffffffff978,(double *)0x4848a9);
        if (tVar1) {
          in_stack_fffffffffffff998 = &in_RDI->_solver;
          local_518._0_8_ =
               (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x3e112e0be826d695;
          SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::entertol(in_stack_fffffffffffff998);
          local_a8 = (_func_int **)(local_518 + 8);
          local_b0 = (Item *)local_518;
          local_b8 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)local_550;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                      *)&stack0xffffffffffffff47,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_b8);
          local_a0 = local_518 + 8;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff980);
          local_90 = local_518 + 8;
          local_88 = local_b0;
          local_98 = local_b8;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff980,
                     (double *)in_stack_fffffffffffff978,(cpp_dec_float<50U,_int,_void> *)0x484999);
          SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::scaleEntertol(in_stack_fffffffffffff980,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)in_stack_fffffffffffff978);
        }
        else {
          in_stack_fffffffffffff990 = &in_RDI->_solver;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff990,
                     (double)in_stack_fffffffffffff988,in_stack_fffffffffffff980);
          SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::scaleEntertol(in_stack_fffffffffffff980,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)in_stack_fffffffffffff978);
        }
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::entertol(in_stack_fffffffffffff998);
        local_5d4[1] = 0xe826d695;
        local_5d4[2] = 0x3e112e0b;
        local_228[0xa1] =
             boost::multiprecision::operator<=
                       ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)in_stack_fffffffffffff978,(double *)0x484a7b);
        local_228[0xa5] = 0;
      }
      setIntParam(in_stack_fffffffffffffa48,in_stack_fffffffffffffa44,in_stack_fffffffffffffa40,
                  (bool)in_stack_fffffffffffffa3f);
      if ((local_228[0x9e] & 1) != 0) break;
      if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)0xfffffffffffffff8) &&
         (VVar2 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar2)) {
        local_5d4[0] = SPxOut::getVerbosity(&in_RDI->spxout);
        local_5d8 = INFO1;
        SPxOut::setVerbosity(&in_RDI->spxout,&local_5d8);
        soplex::operator<<((SPxOut *)in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978);
        soplex::operator<<((SPxOut *)in_stack_fffffffffffff980,
                           (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff978);
        SPxOut::setVerbosity(&in_RDI->spxout,local_5d4);
      }
      in_stack_fffffffffffff988 = &in_RDI->_solver;
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::type(&in_RDI->_solver);
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setType(in_stack_fffffffffffff990,(Type)((ulong)in_stack_fffffffffffff988 >> 0x20));
      pSVar4 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::ratiotester(&in_RDI->_solver);
      if (pSVar4 == &(in_RDI->_ratiotesterTextbook).
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ) {
        setIntParam(in_stack_fffffffffffffa48,in_stack_fffffffffffffa44,in_stack_fffffffffffffa40,
                    (bool)in_stack_fffffffffffffa3f);
      }
      else {
        setIntParam(in_stack_fffffffffffffa48,in_stack_fffffffffffffa44,in_stack_fffffffffffffa40,
                    (bool)in_stack_fffffffffffffa3f);
      }
      local_228[0x9e] = 1;
      local_228[0xa5] = 0;
    }
    if ((local_228[0x9d] & 1) != 0) break;
    if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)0xfffffffffffffff8) &&
       (VVar2 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar2)) {
      local_5e4[2] = SPxOut::getVerbosity(&in_RDI->spxout);
      local_5e4[1] = 3;
      SPxOut::setVerbosity(&in_RDI->spxout,local_5e4 + 1);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff980,
                         (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff978);
      SPxOut::setVerbosity(&in_RDI->spxout,local_5e4 + 2);
    }
    in_stack_fffffffffffff980 = &in_RDI->_solver;
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::type(&in_RDI->_solver);
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::setType(in_stack_fffffffffffff990,(Type)((ulong)in_stack_fffffffffffff988 >> 0x20));
    pSVar5 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::pricer(&in_RDI->_solver);
    if ((SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)pSVar5 == &in_RDI->_pricerDevex) {
      setIntParam(in_stack_fffffffffffffa48,in_stack_fffffffffffffa44,in_stack_fffffffffffffa40,
                  (bool)in_stack_fffffffffffffa3f);
    }
    else {
      setIntParam(in_stack_fffffffffffffa48,in_stack_fffffffffffffa44,in_stack_fffffffffffffa40,
                  (bool)in_stack_fffffffffffffa3f);
    }
    local_228[0x9d] = 1;
    local_228[0xa5] = 0;
  }
  if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)0xfffffffffffffff8) &&
     (VVar2 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar2)) {
    local_5e4[0] = SPxOut::getVerbosity(&in_RDI->spxout);
    local_5e8 = INFO1;
    SPxOut::setVerbosity(&in_RDI->spxout,&local_5e8);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff980,
                       (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff978);
    SPxOut::setVerbosity(&in_RDI->spxout,local_5e4);
  }
LAB_00484ded:
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff980,
             (cpp_dec_float<50U,_int,_void> *)&in_RDI->_slufactor);
  SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setMarkowitz(in_stack_fffffffffffff9b0,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)in_stack_fffffffffffff9a8);
  setIntParam(in_stack_fffffffffffffa48,in_stack_fffffffffffffa44,in_stack_fffffffffffffa40,
              (bool)in_stack_fffffffffffffa3f);
  setIntParam(in_stack_fffffffffffffa48,in_stack_fffffffffffffa44,in_stack_fffffffffffffa40,
              (bool)in_stack_fffffffffffffa3f);
  setIntParam(in_stack_fffffffffffffa48,in_stack_fffffffffffffa44,in_stack_fffffffffffffa40,
              (bool)in_stack_fffffffffffffa3f);
  setIntParam(in_stack_fffffffffffffa48,in_stack_fffffffffffffa44,in_stack_fffffffffffffa40,
              (bool)in_stack_fffffffffffffa3f);
  setIntParam(in_stack_fffffffffffffa48,in_stack_fffffffffffffa44,in_stack_fffffffffffffa40,
              (bool)in_stack_fffffffffffffa3f);
  return local_228._168_4_;
}

Assistant:

typename SPxSolverBase<R>::Status SoPlexBase<R>::_solveRealStable(bool acceptUnbounded,
      bool acceptInfeasible, VectorBase<R>& primal, VectorBase<R>& dual,
      DataArray< typename SPxSolverBase<R>::VarStatus >& basisStatusRows,
      DataArray< typename SPxSolverBase<R>::VarStatus >& basisStatusCols,
      const bool forceNoSimplifier)
{
   typename SPxSolverBase<R>::Status result = SPxSolverBase<R>::UNKNOWN;

   bool fromScratch = false;
   bool solved = false;
   bool solvedFromScratch = false;
   bool initialSolve = true;
   bool increasedMarkowitz = false;
   bool relaxedTolerances = false;
   bool tightenedTolerances = false;
   bool switchedScaler = false;
   bool switchedSimplifier = false;
   bool switchedRatiotester = false;
   bool switchedPricer = false;
   bool turnedoffPre = false;

   R markowitz = _slufactor.markowitz();
   int ratiotester = intParam(SoPlexBase<R>::RATIOTESTER);
   int pricer = intParam(SoPlexBase<R>::PRICER);
   int simplifier = intParam(SoPlexBase<R>::SIMPLIFIER);
   int scaler = intParam(SoPlexBase<R>::SCALER);
   int type = intParam(SoPlexBase<R>::ALGORITHM);

   if(forceNoSimplifier)
      setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_OFF);

   while(true)
   {
      assert(!increasedMarkowitz || GE(_slufactor.markowitz(), R(0.9), this->tolerances()->epsilon()));

      result = _solveRealForRational(fromScratch, primal, dual, basisStatusRows, basisStatusCols);

      solved = (result == SPxSolverBase<R>::OPTIMAL)
               || (result == SPxSolverBase<R>::INFEASIBLE && acceptInfeasible)
               || (result == SPxSolverBase<R>::UNBOUNDED && acceptUnbounded);

      if(solved || result == SPxSolverBase<R>::ABORT_TIME || result == SPxSolverBase<R>::ABORT_ITER)
         break;

      if(initialSolve)
      {
         SPX_MSG_INFO1(spxout, spxout << "Numerical troubles during floating-point solve." << std::endl);
         initialSolve = false;
      }

      if(!turnedoffPre
            && (intParam(SoPlexBase<R>::SIMPLIFIER) != SoPlexBase<R>::SIMPLIFIER_OFF
                || intParam(SoPlexBase<R>::SCALER) != SoPlexBase<R>::SCALER_OFF))
      {
         SPX_MSG_INFO1(spxout, spxout << "Turning off preprocessing." << std::endl);

         turnedoffPre = true;

         setIntParam(SoPlexBase<R>::SCALER, SoPlexBase<R>::SCALER_OFF);
         setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_OFF);

         fromScratch = true;
         solvedFromScratch = true;
         continue;
      }

      setIntParam(SoPlexBase<R>::SCALER, scaler);
      setIntParam(SoPlexBase<R>::SIMPLIFIER, simplifier);

      if(!increasedMarkowitz)
      {
         SPX_MSG_INFO1(spxout, spxout << "Increasing Markowitz threshold." << std::endl);

         _slufactor.setMarkowitz(0.9);
         increasedMarkowitz = true;

         try
         {
            _solver.factorize();
            continue;
         }
         catch(...)
         {
            SPxOut::debug(this, "Factorization failed.\n");
         }
      }

      if(!solvedFromScratch)
      {
         SPX_MSG_INFO1(spxout, spxout << "Solving from scratch." << std::endl);

         fromScratch = true;
         solvedFromScratch = true;
         continue;
      }

      setIntParam(SoPlexBase<R>::RATIOTESTER, ratiotester);
      setIntParam(SoPlexBase<R>::PRICER, pricer);

      if(!switchedScaler)
      {
         SPX_MSG_INFO1(spxout, spxout << "Switching scaling." << std::endl);

         if(scaler == int(SoPlexBase<R>::SCALER_OFF))
            setIntParam(SoPlexBase<R>::SCALER, SoPlexBase<R>::SCALER_BIEQUI);
         else
            setIntParam(SoPlexBase<R>::SCALER, SoPlexBase<R>::SCALER_OFF);

         fromScratch = true;
         solvedFromScratch = true;
         switchedScaler = true;
         continue;
      }

      if(!switchedSimplifier && !forceNoSimplifier)
      {
         SPX_MSG_INFO1(spxout, spxout << "Switching simplification." << std::endl);

         if(simplifier == int(SoPlexBase<R>::SIMPLIFIER_OFF))
            setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_INTERNAL);
         else
            setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_OFF);

         fromScratch = true;
         solvedFromScratch = true;
         switchedSimplifier = true;
         continue;
      }

      setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_OFF);

      if(!relaxedTolerances)
      {
         SPX_MSG_INFO1(spxout, spxout << "Relaxing tolerances." << std::endl);

         setIntParam(SoPlexBase<R>::ALGORITHM, SoPlexBase<R>::ALGORITHM_PRIMAL);

         // scale tols by up 1e3 but so that they do not exceed 1e-3
         if(_solver.entertol() > 1e-6)
            _solver.scaleEntertol(1e-3 / _solver.entertol());
         else
            _solver.scaleEntertol(1e3);

         if(_solver.leavetol() > 1e-6)
            _solver.scaleLeavetol(1e-3 / _solver.leavetol());
         else
            _solver.scaleLeavetol(1e3);

         relaxedTolerances = _solver.entertol() >= 1e-3;
         solvedFromScratch = false;
         continue;
      }

      if(!tightenedTolerances && result != SPxSolverBase<R>::INFEASIBLE)
      {
         SPX_MSG_INFO1(spxout, spxout << "Tightening tolerances." << std::endl);

         setIntParam(SoPlexBase<R>::ALGORITHM, SoPlexBase<R>::ALGORITHM_DUAL);

         // scale tols by up 1e-3 but so that they are not smaller than 1e-9
         if(_solver.entertol() < 1e-6)
            _solver.scaleEntertol(1e-9 / _solver.entertol());
         else
            _solver.scaleEntertol(1e-3);

         tightenedTolerances = _solver.entertol() <= 1e-9;
         solvedFromScratch = false;
         continue;
      }

      setIntParam(SoPlexBase<R>::ALGORITHM, type);

      if(!switchedRatiotester)
      {
         SPX_MSG_INFO1(spxout, spxout << "Switching ratio test." << std::endl);

         _solver.setType(_solver.type() == SPxSolverBase<R>::LEAVE ? SPxSolverBase<R>::ENTER :
                         SPxSolverBase<R>::LEAVE);

         if(_solver.ratiotester() != (SPxRatioTester<R>*)&_ratiotesterTextbook)
            setIntParam(SoPlexBase<R>::RATIOTESTER, RATIOTESTER_TEXTBOOK);
         else
            setIntParam(SoPlexBase<R>::RATIOTESTER, RATIOTESTER_FAST);

         switchedRatiotester = true;
         solvedFromScratch = false;
         continue;
      }

      if(!switchedPricer)
      {
         SPX_MSG_INFO1(spxout, spxout << "Switching pricer." << std::endl);

         _solver.setType(_solver.type() == SPxSolverBase<R>::LEAVE ? SPxSolverBase<R>::ENTER :
                         SPxSolverBase<R>::LEAVE);

         if(_solver.pricer() != (SPxPricer<R>*)&_pricerDevex)
            setIntParam(SoPlexBase<R>::PRICER, PRICER_DEVEX);
         else
            setIntParam(SoPlexBase<R>::PRICER, PRICER_STEEP);

         switchedPricer = true;
         solvedFromScratch = false;
         continue;
      }

      SPX_MSG_INFO1(spxout, spxout << "Giving up." << std::endl);

      break;
   }

   _slufactor.setMarkowitz(markowitz);

   setIntParam(SoPlexBase<R>::RATIOTESTER, ratiotester);
   setIntParam(SoPlexBase<R>::PRICER, pricer);
   setIntParam(SoPlexBase<R>::SIMPLIFIER, simplifier);
   setIntParam(SoPlexBase<R>::SCALER, scaler);
   setIntParam(SoPlexBase<R>::ALGORITHM, type);

   return result;
}